

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator::GenerateSerializationCode
          (RepeatedImmutableEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  char *text;
  
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  text = 
  "for (int i = 0; i < $name$_.size(); i++) {\n  output.writeEnum($number$, $name$_.get(i));\n}\n";
  if (bVar1) {
    text = 
    "if (get$capitalized_name$List().size() > 0) {\n  output.writeUInt32NoTag($tag$);\n  output.writeUInt32NoTag($name$MemoizedSerializedSize);\n}\nfor (int i = 0; i < $name$_.size(); i++) {\n  output.writeEnumNoTag($name$_.get(i));\n}\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void RepeatedImmutableEnumFieldGenerator::GenerateSerializationCode(
    io::Printer* printer) const {
  if (descriptor_->is_packed()) {
    printer->Print(variables_,
                   "if (get$capitalized_name$List().size() > 0) {\n"
                   "  output.writeUInt32NoTag($tag$);\n"
                   "  output.writeUInt32NoTag($name$MemoizedSerializedSize);\n"
                   "}\n"
                   "for (int i = 0; i < $name$_.size(); i++) {\n"
                   "  output.writeEnumNoTag($name$_.get(i));\n"
                   "}\n");
  } else {
    printer->Print(variables_,
                   "for (int i = 0; i < $name$_.size(); i++) {\n"
                   "  output.writeEnum($number$, $name$_.get(i));\n"
                   "}\n");
  }
}